

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFactory.h
# Opt level: O2

void __thiscall
MinVR::VRFactory::registerItemType<MinVR::VRDisplayNode,MinVR::VRViewportNode>
          (VRFactory *this,string *typeName)

{
  VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRViewportNode> *this_00;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->_registeredTypes,typeName);
  this_00 = (VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRViewportNode> *)operator_new(0x28)
  ;
  VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRViewportNode>::VRConcreteItemFactory
            (this_00,typeName);
  addSubFactory(this,(VRItemFactory *)this_00);
  return;
}

Assistant:

void VRFactory::registerItemType(const std::string typeName) {

  _registeredTypes.push_back(typeName);

  addSubFactory(new VRConcreteItemFactory<ParentType, T>(typeName));
}